

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF8ToUTF16BE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  uchar *processed;
  byte bVar5;
  uint uVar4;
  int iVar6;
  long lVar7;
  unsigned_short *out;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  long lVar11;
  
  iVar2 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar3 = outb;
      pbVar9 = in;
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        iVar2 = *outlen;
        do {
          bVar5 = *pbVar9;
          uVar4 = (uint)bVar5;
          lVar7 = 0;
          if ((char)bVar5 < '\0') {
            if (bVar5 < 0xc0) {
LAB_001448f8:
              *outlen = (int)((ulong)((long)pbVar3 - (long)outb) >> 1);
              *inlen = (int)pbVar9 - (int)in;
              return -2;
            }
            if (bVar5 < 0xe0) {
              uVar4 = bVar5 & 0x1f;
              lVar7 = 1;
            }
            else if (bVar5 < 0xf0) {
              uVar4 = bVar5 & 0xf;
              lVar7 = 2;
            }
            else {
              if (0xf7 < bVar5) goto LAB_001448f8;
              uVar4 = bVar5 & 7;
              lVar7 = 3;
            }
          }
          pbVar10 = pbVar9 + 1;
          iVar6 = (int)lVar7;
          if ((long)pbVar8 - (long)pbVar10 < lVar7) break;
          if (pbVar10 < pbVar8 && (char)bVar5 < '\0') {
            pbVar1 = pbVar9 + 2;
            do {
              pbVar10 = pbVar1;
              iVar6 = iVar6 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar4 = pbVar10[-1] & 0x3f | uVar4 << 6, iVar6 == 0)) break;
              pbVar1 = pbVar10 + 1;
            } while (pbVar10 < pbVar8);
          }
          bVar5 = (byte)(uVar4 >> 8);
          if (uVar4 < 0x10000) {
            if (outb + (long)(iVar2 / 2) * 2 <= pbVar3) break;
            *pbVar3 = bVar5;
            lVar7 = 2;
            lVar11 = 1;
          }
          else {
            if ((0x10ffff < uVar4) || (outb + (long)(iVar2 / 2) * 2 <= pbVar3 + 2)) break;
            *pbVar3 = (byte)(uVar4 - 0x10000 >> 0x12) | 0xd8;
            pbVar3[1] = (byte)(uVar4 - 0x10000 >> 10);
            pbVar3[2] = bVar5 & 3 | 0xdc;
            lVar7 = 4;
            lVar11 = 3;
          }
          pbVar3[lVar11] = (byte)uVar4;
          pbVar3 = pbVar3 + lVar7;
          pbVar9 = pbVar10;
          if (pbVar8 <= pbVar10) break;
        } while( true );
      }
      *outlen = (int)pbVar3 - (int)outb;
      *inlen = (int)pbVar9 - (int)in;
      return *outlen;
    }
    iVar2 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar2;
}

Assistant:

static int
UTF8ToUTF16BE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF-16BE has no BOM */
    if ((outb == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0)  {
          /* trailing byte in leading position */
	  *outlen = out - outstart;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
          /* no chance for this in UTF-16 */
	  *outlen = out - outstart;
	  *inlen = processed - instart;
	  return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))  break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)  break;
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) out;
		*tmp = c >> 8;
		*(tmp + 1) = c;
		out++;
	    } else {
		*out++ = c;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)  break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = tmp1 >> 8;
		*(tmp + 1) = (unsigned char) tmp1;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp = tmp2 >> 8;
		*(tmp + 1) = (unsigned char) tmp2;
		out++;
	    } else {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}